

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_ManSaveModel(Cbs2_Man_t *p,Vec_Int_t *vCex)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  bool bVar3;
  int local_20;
  int iVar;
  int iLit;
  int i;
  Vec_Int_t *vCex_local;
  Cbs2_Man_t *p_local;
  
  Vec_IntClear(vCex);
  (p->pProp).iHead = 0;
  iVar = (p->pProp).iHead;
  while( true ) {
    bVar3 = false;
    if (iVar < (p->pProp).iTail) {
      local_20 = (p->pProp).pData[iVar];
      bVar3 = local_20 != 0;
    }
    if (!bVar3) break;
    iVar1 = Abc_Lit2Var(local_20);
    pObj = Gia_ManObj(p->pAig,iVar1);
    iVar2 = Gia_ObjIsCi(pObj);
    if (iVar2 != 0) {
      iVar2 = Gia_ManIdToCioId(p->pAig,iVar1);
      iVar1 = Cbs2_VarValue(p,iVar1);
      iVar1 = Abc_Var2Lit(iVar2,(uint)((iVar1 != 0 ^ 0xffU) & 1));
      Vec_IntPush(vCex,iVar1);
    }
    iVar = iVar + 1;
  }
  return;
}

Assistant:

static inline void Cbs2_ManSaveModel( Cbs2_Man_t * p, Vec_Int_t * vCex )
{
    int i, iLit;
    Vec_IntClear( vCex );
    p->pProp.iHead = 0;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        int iVar = Abc_Lit2Var(iLit);
        if ( Gia_ObjIsCi(Gia_ManObj(p->pAig, iVar)) )
            Vec_IntPush( vCex, Abc_Var2Lit(Gia_ManIdToCioId(p->pAig, iVar), !Cbs2_VarValue(p, iVar)) );
    }
}